

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treemodel.cpp
# Opt level: O3

UINT32 __thiscall TreeModel::base(TreeModel *this,UModelIndex *current)

{
  UINT32 UVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  UModelIndex parent;
  UModelIndex local_38;
  
  UVar1 = 0;
  if (current->m != (TreeModel *)0x0 && -1 < (current->c | current->r)) {
    TreeModel::parent(&local_38,current->m,current);
    bVar4 = -1 < (current->c | current->r);
    bVar3 = current->m != (TreeModel *)0x0;
    if (((local_38.r < 0) || (local_38.c < 0)) || (local_38.m == (TreeModel *)0x0)) {
      UVar1 = 0;
      if (bVar3 && bVar4) {
        UVar1 = *(UINT32 *)(current->i + 0x18);
      }
    }
    else {
      iVar2 = 0;
      if (bVar3 && bVar4) {
        iVar2 = *(int *)(current->i + 0x18);
      }
      UVar1 = base(this,&local_38);
      UVar1 = UVar1 + iVar2;
    }
  }
  return UVar1;
}

Assistant:

UINT32 TreeModel::base(const UModelIndex &current) const
{
    // Rewrite this as loop if we ever see an image that is too deep for this naive implementation
    if (!current.isValid())
        return 0;
    
    UModelIndex parent = current.parent();
    if (!parent.isValid())
        return offset(current);
    else {
        return offset(current) + base(parent);
    }
}